

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O0

void dCreate_CompCol_Matrix
               (SuperMatrix *A,int m,int n,int_t nnz,double *nzval,int_t *rowind,int_t *colptr,
               Stype_t stype,Dtype_t dtype,Mtype_t mtype)

{
  int_t *piVar1;
  void *pvVar2;
  char local_138 [8];
  char msg [256];
  NCformat *Astore;
  int_t *rowind_local;
  double *nzval_local;
  int_t nnz_local;
  int n_local;
  int m_local;
  SuperMatrix *A_local;
  
  A->Stype = stype;
  A->Dtype = dtype;
  A->Mtype = mtype;
  A->nrow = m;
  A->ncol = n;
  pvVar2 = superlu_malloc(0x20);
  A->Store = pvVar2;
  if (A->Store == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for A->Store",0x33,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dutil.c");
    superlu_abort_and_exit(local_138);
  }
  piVar1 = (int_t *)A->Store;
  *piVar1 = nnz;
  *(double **)(piVar1 + 2) = nzval;
  *(int_t **)(piVar1 + 4) = rowind;
  *(int_t **)(piVar1 + 6) = colptr;
  return;
}

Assistant:

void
dCreate_CompCol_Matrix(SuperMatrix *A, int m, int n, int_t nnz, 
		       double *nzval, int_t *rowind, int_t *colptr,
		       Stype_t stype, Dtype_t dtype, Mtype_t mtype)
{
    NCformat *Astore;

    A->Stype = stype;
    A->Dtype = dtype;
    A->Mtype = mtype;
    A->nrow = m;
    A->ncol = n;
    A->Store = (void *) SUPERLU_MALLOC( sizeof(NCformat) );
    if ( !(A->Store) ) ABORT("SUPERLU_MALLOC fails for A->Store");
    Astore = A->Store;
    Astore->nnz = nnz;
    Astore->nzval = nzval;
    Astore->rowind = rowind;
    Astore->colptr = colptr;
}